

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadPool.h
# Opt level: O2

void __thiscall depspawn::internal::ThreadPool::main(ThreadPool *this)

{
  int iVar1;
  unique_lock<std::mutex> my_lock;
  unique_lock<std::mutex> local_40;
  
  do {
    if (this->finish_ != false) {
      return;
    }
    std::unique_lock<std::mutex>::unique_lock(&local_40,&this->mutex_);
    while ((this->ready_ == false && (this->finish_ == false))) {
      std::condition_variable::wait((unique_lock *)&this->cond_var_);
    }
    iVar1 = this->count_;
    this->count_ = iVar1 + 1;
    if ((long)(this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl
              .super__Vector_impl_data._M_finish -
        (long)(this->threads_).super__Vector_base<std::thread,_std::allocator<std::thread>_>._M_impl
              .super__Vector_impl_data._M_start >> 3 == (long)this->count_) {
      this->ready_ = false;
    }
    std::unique_lock<std::mutex>::unlock(&local_40);
    if ((this->finish_ != true) && (iVar1 < this->nthreads_in_use_)) {
      std::function<void_()>::operator()(&this->func_);
    }
    do {
      if (this->ready_ != true) break;
    } while (this->finish_ != true);
    std::unique_lock<std::mutex>::lock(&local_40);
    this->count_ = this->count_ + -1;
    std::unique_lock<std::mutex>::unlock(&local_40);
    std::unique_lock<std::mutex>::~unique_lock(&local_40);
  } while( true );
}

Assistant:

void main()
  {
    while (!finish_) {
      std::unique_lock<std::mutex> my_lock(mutex_);
      while (!ready_ && !finish_) {
        cond_var_.wait(my_lock);
      }
      const int my_id = count_++;
      if(count_ == threads_.size()) {
        ready_ = false;
      }
      my_lock.unlock();

      if (!finish_ && (my_id < nthreads_in_use_)) {
        func_();
      }

      while(ready_ && !finish_) {} // ensure all threads restarted
      my_lock.lock();
      count_--;
      my_lock.unlock();

      //wait();
    }
  }